

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::getCommonFuncCaseName_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  char *__s;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __s = glu::getDataTypeName((DataType)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_61);
  std::operator+(&local_60,&local_40,
                 _ZZN4deqp5gles310FunctionalL19getPrecisionPostfixEN3glu9PrecisionEE9s_postfix_rel +
                 *(int *)(
                         _ZZN4deqp5gles310FunctionalL19getPrecisionPostfixEN3glu9PrecisionEE9s_postfix_rel
                         + (ulong)baseType * 4));
  std::operator+(__return_storage_ptr__,&local_60,
                 (char *)((long)&
                                _ZZN4deqp5gles310FunctionalL20getShaderTypePostfixEN3glu10ShaderTypeEE9s_postfix_rel
                         + (long)*(int *)((long)&
                                                _ZZN4deqp5gles310FunctionalL20getShaderTypePostfixEN3glu10ShaderTypeEE9s_postfix_rel
                                         + (ulong)precision * 4)));
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string getCommonFuncCaseName (glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
{
	return string(glu::getDataTypeName(baseType)) + getPrecisionPostfix(precision) + getShaderTypePostfix(shaderType);
}